

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

bool __thiscall cmArchiveWrite::AddPath(cmArchiveWrite *this,char *path,size_t skip,char *prefix)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  bool local_12a;
  char *file;
  unsigned_long i;
  unsigned_long n;
  size_type end;
  string local_e0 [8];
  string next;
  string local_b8;
  Directory local_98;
  Directory d;
  string local_88;
  allocator local_51;
  string local_50;
  char *local_30;
  char *prefix_local;
  size_t skip_local;
  char *path_local;
  cmArchiveWrite *this_local;
  
  local_30 = prefix;
  prefix_local = (char *)skip;
  skip_local = (size_t)path;
  path_local = (char *)this;
  bVar2 = AddFile(this,path,skip,prefix);
  sVar1 = skip_local;
  if (!bVar2) {
    this_local._7_1_ = 0;
    goto LAB_0059f7ca;
  }
  std::allocator<char>::allocator();
  d.Internal._6_1_ = 0;
  d.Internal._5_1_ = 0;
  std::__cxx11::string::string((string *)&local_50,(char *)sVar1,&local_51);
  bVar2 = cmsys::SystemTools::FileIsDirectory(&local_50);
  sVar1 = skip_local;
  local_12a = true;
  if (bVar2) {
    std::allocator<char>::allocator();
    d.Internal._6_1_ = 1;
    std::__cxx11::string::string
              ((string *)&local_88,(char *)sVar1,(allocator *)((long)&d.Internal + 7));
    d.Internal._5_1_ = 1;
    local_12a = cmsys::SystemTools::FileIsSymlink(&local_88);
  }
  if ((d.Internal._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if ((d.Internal._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&d.Internal + 7));
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (local_12a != false) {
    this_local._7_1_ = 1;
    goto LAB_0059f7ca;
  }
  cmsys::Directory::Directory(&local_98);
  sVar1 = skip_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b8,(char *)sVar1,(allocator *)(next.field_2._M_local_buf + 0xf));
  bVar2 = cmsys::Directory::Load(&local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)(next.field_2._M_local_buf + 0xf));
  sVar1 = skip_local;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,(char *)sVar1,(allocator *)((long)&end + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&end + 7));
    std::__cxx11::string::operator+=(local_e0,"/");
    uVar4 = std::__cxx11::string::size();
    pcVar5 = (char *)cmsys::Directory::GetNumberOfFiles(&local_98);
    for (file = (char *)0x0; file < pcVar5; file = file + 1) {
      pcVar6 = cmsys::Directory::GetFile(&local_98,(unsigned_long)file);
      iVar3 = strcmp(pcVar6,".");
      if ((iVar3 != 0) && (iVar3 = strcmp(pcVar6,".."), iVar3 != 0)) {
        std::__cxx11::string::erase((ulong)local_e0,uVar4);
        std::__cxx11::string::operator+=(local_e0,pcVar6);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar2 = AddPath(this,pcVar6,(size_t)prefix_local,local_30);
        if (!bVar2) {
          this_local._7_1_ = 0;
          bVar2 = true;
          goto LAB_0059f786;
        }
      }
    }
    bVar2 = false;
LAB_0059f786:
    std::__cxx11::string::~string(local_e0);
    if (!bVar2) goto LAB_0059f7a0;
  }
  else {
LAB_0059f7a0:
    this_local._7_1_ = 1;
  }
  cmsys::Directory::~Directory(&local_98);
LAB_0059f7ca:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmArchiveWrite::AddPath(const char* path,
                             size_t skip, const char* prefix)
{
  if(!this->AddFile(path, skip, prefix))
    {
    return false;
    }
  if(!cmSystemTools::FileIsDirectory(path) ||
    cmSystemTools::FileIsSymlink(path))
    {
    return true;
    }
  cmsys::Directory d;
  if(d.Load(path))
    {
    std::string next = path;
    next += "/";
    std::string::size_type end = next.size();
    unsigned long n = d.GetNumberOfFiles();
    for(unsigned long i = 0; i < n; ++i)
      {
      const char* file = d.GetFile(i);
      if(strcmp(file, ".") != 0 && strcmp(file, "..") != 0)
        {
        next.erase(end);
        next += file;
        if(!this->AddPath(next.c_str(), skip, prefix))
          {
          return false;
          }
        }
      }
    }
  return true;
}